

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsLongStressCase.cpp
# Opt level: O0

void __thiscall
deqp::gls::LongStressCaseInternal::DebugInfoRenderer::render(DebugInfoRenderer *this)

{
  deUint32 program;
  GLuint index;
  reference pointer;
  size_type sVar1;
  reference indices;
  int posloc;
  int prog;
  DebugInfoRenderer *this_local;
  
  program = glu::ShaderProgram::getProgram(this->m_prog);
  index = glwGetAttribLocation(program,"a_pos");
  glwUseProgram(program);
  glwBindBuffer(0x8892,0);
  glwBindBuffer(0x8893,0);
  glwEnableVertexAttribArray(index);
  pointer = std::vector<float,_std::allocator<float>_>::operator[](&this->m_posBuf,0);
  glwVertexAttribPointer(index,2,0x1406,'\0',0,pointer);
  sVar1 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::size(&this->m_ndxBuf);
  indices = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                      (&this->m_ndxBuf,0);
  glwDrawElements(4,(GLsizei)sVar1,0x1403,indices);
  glwDisableVertexAttribArray(index);
  std::vector<float,_std::allocator<float>_>::clear(&this->m_posBuf);
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::clear(&this->m_ndxBuf);
  return;
}

Assistant:

void DebugInfoRenderer::render (void)
{
	const int prog		= m_prog->getProgram();
	const int posloc	= glGetAttribLocation(prog, "a_pos");

	glUseProgram(prog);
	glBindBuffer(GL_ARRAY_BUFFER, 0);
	glBindBuffer(GL_ELEMENT_ARRAY_BUFFER, 0);
	glEnableVertexAttribArray(posloc);
	glVertexAttribPointer(posloc, 2, GL_FLOAT, 0, 0, &m_posBuf[0]);
	glDrawElements(GL_TRIANGLES, (int)m_ndxBuf.size(), GL_UNSIGNED_SHORT, &m_ndxBuf[0]);
	glDisableVertexAttribArray(posloc);

	m_posBuf.clear();
	m_ndxBuf.clear();
}